

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::CopyFileAlways(string *source,string *destination)

{
  bool bVar1;
  bool bVar2;
  mode_t perm;
  string real_destination;
  string destination_dir;
  ifstream fin;
  size_type local_1428;
  byte abStack_1410 [488];
  ofstream fout;
  byte abStack_1208 [480];
  char buffer [4096];
  
  bVar1 = SameFile(source,destination);
  if (bVar1) {
    return true;
  }
  perm = 0;
  bVar1 = GetPermissions(source,&perm);
  std::__cxx11::string::string((string *)&real_destination,(string *)destination);
  destination_dir._M_dataplus._M_p = (pointer)&destination_dir.field_2;
  destination_dir._M_string_length = 0;
  destination_dir.field_2._M_local_buf[0] = '\0';
  bVar2 = FileExists(destination);
  if ((bVar2) && (bVar2 = FileIsDirectory(destination), bVar2)) {
    std::__cxx11::string::_M_assign((string *)&destination_dir);
    ConvertToUnixSlashes(&real_destination);
    std::__cxx11::string::push_back((char)&real_destination);
    std::__cxx11::string::string((string *)&fin,(string *)source);
    GetFilenameName((string *)&fout,(string *)&fin);
    std::__cxx11::string::append((string *)&real_destination);
    std::__cxx11::string::~string((string *)&fout);
  }
  else {
    GetFilenamePath((string *)&fin,destination);
    std::__cxx11::string::operator=((string *)&destination_dir,(string *)&fin);
  }
  std::__cxx11::string::~string((string *)&fin);
  MakeDirectory(&destination_dir);
  std::ifstream::ifstream(&fin,(source->_M_dataplus)._M_p,_S_in|_S_bin);
  if ((abStack_1410[*(long *)(_fin + -0x18)] & 5) != 0) {
    bVar1 = false;
    goto LAB_00125a15;
  }
  RemoveFile(&real_destination);
  std::ofstream::ofstream(&fout,real_destination._M_dataplus._M_p,_S_trunc|_S_out|_S_bin);
  if ((abStack_1208[*(long *)(_fout + -0x18)] & 5) == 0) {
    while (((abStack_1410[*(long *)(_fin + -0x18)] & 5) == 0 &&
           (std::istream::read((char *)&fin,(long)buffer), local_1428 != 0))) {
      std::ostream::write((char *)&fout,(long)buffer);
    }
    std::ostream::flush();
    std::ifstream::close();
    std::ofstream::close();
    if (((abStack_1208[*(long *)(_fout + -0x18)] & 5) != 0) ||
       ((bVar1 && (bVar1 = SetPermissions(&real_destination,perm), !bVar1)))) goto LAB_00125a06;
    bVar1 = true;
  }
  else {
LAB_00125a06:
    bVar1 = false;
  }
  std::ofstream::~ofstream(&fout);
LAB_00125a15:
  std::ifstream::~ifstream(&fin);
  std::__cxx11::string::~string((string *)&destination_dir);
  std::__cxx11::string::~string((string *)&real_destination);
  return bVar1;
}

Assistant:

bool SystemTools::CopyFileAlways(const kwsys_stl::string& source, const kwsys_stl::string& destination)
{
  // If files are the same do not copy
  if ( SystemTools::SameFile(source, destination) )
    {
    return true;
    }
  mode_t perm = 0;
  bool perms = SystemTools::GetPermissions(source, perm);

  const int bufferSize = 4096;
  char buffer[bufferSize];

  // If destination is a directory, try to create a file with the same
  // name as the source in that directory.

  kwsys_stl::string real_destination = destination;
  kwsys_stl::string destination_dir;
  if(SystemTools::FileExists(destination) &&
     SystemTools::FileIsDirectory(destination))
    {
    destination_dir = real_destination;
    SystemTools::ConvertToUnixSlashes(real_destination);
    real_destination += '/';
    kwsys_stl::string source_name = source;
    real_destination += SystemTools::GetFilenameName(source_name);
    }
  else
    {
    destination_dir = SystemTools::GetFilenamePath(destination);
    }

  // Create destination directory

  SystemTools::MakeDirectory(destination_dir);

  // Open files
#if defined(_WIN32)
  kwsys::ifstream fin(Encoding::ToNarrow(
    SystemTools::ConvertToWindowsExtendedPath(source)).c_str(),
                kwsys_ios::ios::in | kwsys_ios_binary);
#else
  kwsys::ifstream fin(source.c_str(),
                kwsys_ios::ios::in | kwsys_ios_binary);
#endif
  if(!fin)
    {
    return false;
    }

  // try and remove the destination file so that read only destination files
  // can be written to.
  // If the remove fails continue so that files in read only directories
  // that do not allow file removal can be modified.
  SystemTools::RemoveFile(real_destination);

#if defined(_WIN32)
  kwsys::ofstream fout(Encoding::ToNarrow(
    SystemTools::ConvertToWindowsExtendedPath(real_destination)).c_str(),
                     kwsys_ios::ios::out | kwsys_ios::ios::trunc | kwsys_ios_binary);
#else
  kwsys::ofstream fout(real_destination.c_str(),
                     kwsys_ios::ios::out | kwsys_ios::ios::trunc | kwsys_ios_binary);
#endif
  if(!fout)
    {
    return false;
    }

  // This copy loop is very sensitive on certain platforms with
  // slightly broken stream libraries (like HPUX).  Normally, it is
  // incorrect to not check the error condition on the fin.read()
  // before using the data, but the fin.gcount() will be zero if an
  // error occurred.  Therefore, the loop should be safe everywhere.
  while(fin)
    {
    fin.read(buffer, bufferSize);
    if(fin.gcount())
      {
      fout.write(buffer, fin.gcount());
      }
    else
      {
      break;
      }
    }

  // Make sure the operating system has finished writing the file
  // before closing it.  This will ensure the file is finished before
  // the check below.
  fout.flush();

  fin.close();
  fout.close();

  if(!fout)
    {
    return false;
    }
  if ( perms )
    {
    if ( !SystemTools::SetPermissions(real_destination, perm) )
      {
      return false;
      }
    }
  return true;
}